

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O3

int dumpFields(MPI_Comm Region,double **U,double **V,double **P,lattice *grid,int n)

{
  char *mode;
  int send;
  int rank;
  int size;
  char uFile [32];
  char pFile [32];
  MPI_Status st;
  int local_a4;
  int local_a0;
  int local_9c;
  double **local_98;
  double **local_90;
  char local_88 [32];
  char local_68 [32];
  undefined1 local_48 [24];
  
  local_a4 = 1;
  local_98 = U;
  local_90 = V;
  MPI_Comm_rank(Region,&local_a0);
  MPI_Comm_size(Region,&local_9c);
  mode = "wb";
  if (local_a0 != 0) {
    mode = "ab";
  }
  sprintf(local_68,"PressureField_%i.vtk",n);
  sprintf(local_88,"MomentumField_%i.vtk",n);
  if (0 < local_a0) {
    MPI_Recv(&local_a4,1,&ompi_mpi_int,local_a0 + -1,0x100,Region,local_48);
  }
  write2Dfield(local_68,P,(long)grid->deli,(long)grid->delj,1,1,mode);
  if (local_a0 + 1 != local_9c) {
    MPI_Send(&local_a4,0,&ompi_mpi_int,local_a0 + 1,0x100);
  }
  if (0 < local_a0) {
    MPI_Recv(&local_a4,0,&ompi_mpi_int,local_a0 + -1,0x101,Region,local_48);
  }
  write2Dfield(local_88,local_98,(long)grid->deli + 1,(long)grid->delj + 1,1,0,mode);
  write2Dfield(local_88,local_90,(long)grid->deli + 1,(long)grid->delj + 1,0,1,"ab");
  if (local_a0 + 1 != local_9c) {
    MPI_Send(&local_a4,0,&ompi_mpi_int,local_a0 + 1,0x101,Region);
  }
  return local_a4;
}

Assistant:

int dumpFields (MPI_Comm Region, REAL **U, REAL **V, REAL **P, lattice *grid, int n)
{
	int rank, size, send = 1;
	MPI_Comm_rank(Region,&rank);
	MPI_Comm_size(Region,&size);
	MPI_Status st;
	char pFile[32], uFile[32];
	char *mode = (rank == 0 ? "wb" : "ab");
	sprintf(pFile,"PressureField_%i.vtk",n);
	sprintf(uFile,"MomentumField_%i.vtk",n);
	if (rank > 0)
		MPI_Recv(&send,1,MPI_INT,rank-1,WRITE + 0, Region, &st);
	write2Dfield(pFile,P,grid->deli,grid->delj,1,1,mode);
	if (rank+1 != size)
		MPI_Send(&send,0,MPI_INT,rank+1,WRITE + 0, Region);
	if (rank > 0)
		MPI_Recv(&send,0,MPI_INT,rank-1,WRITE + 1,Region,&st);
	write2Dfield(uFile,U,grid->deli+1,grid->delj+1,1,0,mode);
	write2Dfield(uFile,V,grid->deli+1,grid->delj+1,0,1,"ab");
	if (rank+1 != size)
		MPI_Send(&send,0,MPI_INT,rank+1,WRITE + 1,Region);
	return send;
}